

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O1

void PrintGraph(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule)

{
  OutputContext *pOVar1;
  ulong uVar2;
  
  ctx->code = lowModule->vmModule->code;
  if ((lowModule->functions).count != 0) {
    uVar2 = 0;
    do {
      PrintFunction(ctx,lowModule,(lowModule->functions).data[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (lowModule->functions).count);
  }
  pOVar1 = ctx->output;
  if (pOVar1->outputBufPos != 0) {
    (*pOVar1->writeStream)(pOVar1->stream,pOVar1->outputBuf,pOVar1->outputBufPos);
  }
  pOVar1->outputBufPos = 0;
  return;
}

Assistant:

void PrintGraph(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule)
{
	ctx.code = lowModule->vmModule->code;

	for(unsigned i = 0; i < lowModule->functions.size(); i++)
		PrintFunction(ctx, lowModule, lowModule->functions[i]);

	ctx.output.Flush();
}